

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *this,
          duration<long,_std::ratio<1L,_1000000000L>_> *duration)

{
  string local_50 [32];
  ReusableStringStream rss;
  
  ReusableStringStream::ReusableStringStream(&rss);
  std::ostream::_M_insert<long>((long)rss.m_oss);
  std::operator<<((ostream *)rss.m_oss,' ');
  ratio_string<std::ratio<1l,1000000000l>>::symbol_abi_cxx11_();
  std::operator<<((ostream *)rss.m_oss,local_50);
  std::operator<<((ostream *)rss.m_oss,'s');
  std::__cxx11::string::~string(local_50);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&rss);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::duration<Value, Ratio> const& duration) {
            ReusableStringStream rss;
            rss << duration.count() << ' ' << ratio_string<Ratio>::symbol() << 's';
            return rss.str();
        }